

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O2

bool __thiscall
re2::Prog::SearchOnePass
          (Prog *this,StringPiece *text,StringPiece *const_context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  int iVar1;
  uint uVar2;
  uint8 *puVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int i;
  ulong uVar7;
  int ncap;
  uint uVar8;
  long lVar9;
  byte *pbVar10;
  OneState *pOVar11;
  byte *p;
  uint32 cond;
  ulong uVar12;
  MatchKind local_24c;
  StringPiece context;
  uint32 statesize;
  char *matchcap [10];
  LogMessageFatal local_1b8;
  
  if (kind == kFullMatch || anchor == kAnchored) {
    local_24c = kFullMatch;
    uVar12 = (ulong)(uint)(nmatch * 2);
    if (nmatch * 2 < 3) {
      uVar12 = 2;
    }
    for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
      *(undefined8 *)(&local_1b8.super_LogMessage.severity_ + uVar7 * 2) = 0;
    }
    for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
      matchcap[uVar7] = (char *)0x0;
    }
    context.ptr_ = const_context->ptr_;
    context.length_ = const_context->length_;
    context._12_4_ = *(undefined4 *)&const_context->field_0xc;
    if (context.ptr_ == (char *)0x0) {
      context.length_ = text->length_;
      context.ptr_ = text->ptr_;
    }
    p = (byte *)text->ptr_;
    if ((this->anchor_start_ != true) || ((byte *)context.ptr_ == p)) {
      if (this->anchor_end_ == false) {
        lVar9 = (long)text->length_;
        local_24c = kind;
      }
      else {
        lVar9 = (long)text->length_;
        if ((byte *)(context.ptr_ + context.length_) != p + lVar9) {
          return false;
        }
      }
      puVar3 = this->onepass_nodes_;
      pOVar11 = this->onepass_start_;
      iVar1 = this->onepass_statesize_;
      pbVar10 = p + lVar9;
      matchcap[0] = (char *)p;
      bVar5 = false;
      cond = pOVar11->matchcond;
      for (; ncap = (int)uVar12, p < pbVar10; p = p + 1) {
        uVar2 = pOVar11[(ulong)this->bytemap_[*p] + 1].matchcond;
        if (((uVar2 & 0x3f) == 0) || (bVar6 = Satisfy(uVar2,&context,(char *)p), bVar6)) {
          lVar9 = (ulong)(uVar2 >> 0x10) * (long)iVar1;
          pOVar11 = (OneState *)(puVar3 + lVar9);
          uVar8 = *(uint *)(puVar3 + lVar9);
        }
        else {
          pOVar11 = (OneState *)0x0;
          uVar8 = 0x30;
        }
        if ((((local_24c != kFullMatch) && (cond != 0x30)) &&
            ((uVar8 & 0x3f) != 0 || (uVar2 & 0x40) != 0)) &&
           (((cond & 0x3f) == 0 || (bVar6 = Satisfy(cond,&context,(char *)p), bVar6)))) {
          for (uVar7 = 2; uVar12 != uVar7; uVar7 = uVar7 + 1) {
            matchcap[uVar7] = *(char **)(&local_1b8.super_LogMessage.severity_ + uVar7 * 2);
          }
          if ((1 < nmatch) && ((cond & 0x7f80) != 0)) {
            ApplyCaptures(cond,(char *)p,matchcap,ncap);
          }
          matchcap[1] = (char *)p;
          bVar5 = true;
          if ((local_24c == kFirstMatch) && (bVar5 = true, (uVar2 & 0x40) != 0)) goto LAB_0013c1fe;
        }
        if (pOVar11 == (OneState *)0x0) goto LAB_0013c1de;
        if ((1 < nmatch) && ((uVar2 & 0x7f80) != 0)) {
          ApplyCaptures(uVar2,(char *)p,(char **)&local_1b8,ncap);
        }
        cond = uVar8;
      }
      uVar2 = pOVar11->matchcond;
      if ((uVar2 == 0x30) ||
         (((uVar2 & 0x3f) != 0 && (bVar6 = Satisfy(uVar2,&context,(char *)p), !bVar6)))) {
LAB_0013c1de:
        if (!bVar5) {
          return false;
        }
      }
      else {
        if ((1 < nmatch) && ((uVar2 & 0x7f80) != 0)) {
          ApplyCaptures(uVar2,(char *)p,(char **)&local_1b8,ncap);
        }
        for (uVar7 = 2; uVar12 != uVar7; uVar7 = uVar7 + 1) {
          matchcap[uVar7] = *(char **)(&local_1b8.super_LogMessage.severity_ + uVar7 * 2);
        }
        matchcap[1] = (char *)p;
      }
LAB_0013c1fe:
      uVar7 = 0;
      uVar12 = (ulong)(uint)nmatch;
      if (nmatch < 1) {
        uVar12 = uVar7;
      }
      for (; uVar12 * 0x10 != uVar7; uVar7 = uVar7 + 0x10) {
        uVar4 = *(undefined8 *)((long)matchcap + uVar7);
        iVar1 = *(int *)((long)matchcap + uVar7 + 8);
        *(undefined8 *)((long)&match->ptr_ + uVar7) = uVar4;
        *(int *)((long)&match->length_ + uVar7) = iVar1 - (int)uVar4;
      }
      return true;
    }
  }
  else {
    LogMessageFatal::LogMessageFatal
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/onepass.cc",
               0xd0);
    std::operator<<((ostream *)&local_1b8.super_LogMessage.str_,
                    "Cannot use SearchOnePass for unanchored matches.");
    LogMessageFatal::~LogMessageFatal(&local_1b8);
  }
  return false;
}

Assistant:

bool Prog::SearchOnePass(const StringPiece& text,
                         const StringPiece& const_context,
                         Anchor anchor, MatchKind kind,
                         StringPiece* match, int nmatch) {
  if (anchor != kAnchored && kind != kFullMatch) {
    LOG(DFATAL) << "Cannot use SearchOnePass for unanchored matches.";
    return false;
  }

  // Make sure we have at least cap[1],
  // because we use it to tell if we matched.
  int ncap = 2*nmatch;
  if (ncap < 2)
    ncap = 2;

  const char* cap[kMaxCap];
  for (int i = 0; i < ncap; i++)
    cap[i] = NULL;

  const char* matchcap[kMaxCap];
  for (int i = 0; i < ncap; i++)
    matchcap[i] = NULL;

  StringPiece context = const_context;
  if (context.begin() == NULL)
    context = text;
  if (anchor_start() && context.begin() != text.begin())
    return false;
  if (anchor_end() && context.end() != text.end())
    return false;
  if (anchor_end())
    kind = kFullMatch;

  // State and act are marked volatile to
  // keep the compiler from re-ordering the
  // memory accesses walking over the NFA.
  // This is worth about 5%.
  volatile OneState* state = onepass_start_;
  volatile uint8* nodes = onepass_nodes_;
  volatile uint32 statesize = onepass_statesize_;
  uint8* bytemap = bytemap_;
  const char* bp = text.begin();
  const char* ep = text.end();
  const char* p;
  bool matched = false;
  matchcap[0] = bp;
  cap[0] = bp;
  uint32 nextmatchcond = state->matchcond;
  for (p = bp; p < ep; p++) {
    int c = bytemap[*p & 0xFF];
    uint32 matchcond = nextmatchcond;
    uint32 cond = state->action[c];

    // Determine whether we can reach act->next.
    // If so, advance state and nextmatchcond.
    if ((cond & kEmptyAllFlags) == 0 || Satisfy(cond, context, p)) {
      uint32 nextindex = cond >> kIndexShift;
      state = IndexToNode(nodes, statesize, nextindex);
      nextmatchcond = state->matchcond;
    } else {
      state = NULL;
      nextmatchcond = kImpossible;
    }

    // This code section is carefully tuned.
    // The goto sequence is about 10% faster than the
    // obvious rewrite as a large if statement in the
    // ASCIIMatchRE2 and DotMatchRE2 benchmarks.

    // Saving the match capture registers is expensive.
    // Is this intermediate match worth thinking about?

    // Not if we want a full match.
    if (kind == kFullMatch)
      goto skipmatch;

    // Not if it's impossible.
    if (matchcond == kImpossible)
      goto skipmatch;

    // Not if the possible match is beaten by the certain
    // match at the next byte.  When this test is useless
    // (e.g., HTTPPartialMatchRE2) it slows the loop by
    // about 10%, but when it avoids work (e.g., DotMatchRE2),
    // it cuts the loop execution by about 45%.
    if ((cond & kMatchWins) == 0 && (nextmatchcond & kEmptyAllFlags) == 0)
      goto skipmatch;

    // Finally, the match conditions must be satisfied.
    if ((matchcond & kEmptyAllFlags) == 0 || Satisfy(matchcond, context, p)) {
      for (int i = 2; i < 2*nmatch; i++)
        matchcap[i] = cap[i];
      if (nmatch > 1 && (matchcond & kCapMask))
        ApplyCaptures(matchcond, p, matchcap, ncap);
      matchcap[1] = p;
      matched = true;

      // If we're in longest match mode, we have to keep
      // going and see if we find a longer match.
      // In first match mode, we can stop if the match
      // takes priority over the next state for this input byte.
      // That bit is per-input byte and thus in cond, not matchcond.
      if (kind == kFirstMatch && (cond & kMatchWins))
        goto done;
    }

  skipmatch:
    if (state == NULL)
      goto done;
    if ((cond & kCapMask) && nmatch > 1)
      ApplyCaptures(cond, p, cap, ncap);
  }

  // Look for match at end of input.
  {
    uint32 matchcond = state->matchcond;
    if (matchcond != kImpossible &&
        ((matchcond & kEmptyAllFlags) == 0 || Satisfy(matchcond, context, p))) {
      if (nmatch > 1 && (matchcond & kCapMask))
        ApplyCaptures(matchcond, p, cap, ncap);
      for (int i = 2; i < ncap; i++)
        matchcap[i] = cap[i];
      matchcap[1] = p;
      matched = true;
    }
  }

done:
  if (!matched)
    return false;
  for (int i = 0; i < nmatch; i++)
    match[i].set(matchcap[2*i],
                 static_cast<int>(matchcap[2*i+1] - matchcap[2*i]));
  return true;
}